

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFileSystem.cpp
# Opt level: O3

path * __thiscall
irr::io::CFileSystem::getRelativeFilename
          (path *__return_storage_ptr__,CFileSystem *this,path *filename,path *directory)

{
  char cVar1;
  size_type sVar2;
  pointer pcVar3;
  bool bVar4;
  uint length;
  _List_node_base *p_Var5;
  size_type sVar6;
  _Self __tmp;
  u32 begin;
  long lVar7;
  long lVar8;
  _List_node_base *p_Var9;
  uint uVar10;
  CFileSystem *pCVar11;
  path path2;
  list<irr::core::string<char>,_std::allocator<irr::core::string<char>_>_> list1;
  path ext;
  path file;
  list<irr::core::string<char>,_std::allocator<irr::core::string<char>_>_> list2;
  string<char> local_d8;
  string<char> local_b8;
  CFileSystem *local_98;
  path *local_90;
  undefined1 *local_88;
  undefined8 local_80;
  undefined1 local_78;
  undefined7 uStack_77;
  undefined1 *local_68;
  undefined8 local_60;
  undefined1 local_58;
  undefined7 uStack_57;
  _List_base<irr::core::string<char>,_std::allocator<irr::core::string<char>_>_> local_48;
  
  sVar2 = (filename->str)._M_string_length;
  sVar6 = (directory->str)._M_string_length;
  (__return_storage_ptr__->str)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->str).field_2;
  (__return_storage_ptr__->str)._M_string_length = 0;
  (__return_storage_ptr__->str).field_2._M_local_buf[0] = '\0';
  if ((sVar2 == 0) || (sVar6 == 0)) {
    if (__return_storage_ptr__ != filename) {
      ::std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
    }
  }
  else {
    local_68 = &local_58;
    local_60 = 0;
    local_58 = 0;
    local_88 = &local_78;
    local_80 = 0;
    local_78 = 0;
    local_98 = this;
    local_90 = directory;
    (*(this->super_IFileSystem)._vptr_IFileSystem[0x13])((_List_node_base *)&local_b8);
    length = (uint)local_b8.str._M_string_length;
    if (-1 < (int)length) {
      uVar10 = ~length | 0x80000000;
      p_Var5 = (_List_node_base *)local_b8.str._M_string_length;
      lVar7 = (ulong)(length & 0x7fffffff) + 1;
      do {
        cVar1 = local_b8.str._M_dataplus._M_p[lVar7 + -1];
        begin = (u32)lVar7;
        if (cVar1 == '.') {
          core::string<char>::subString
                    (&local_d8,&local_b8,begin,(int)local_b8.str._M_string_length + uVar10,false);
          ::std::__cxx11::string::_M_assign((string *)&local_88);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8.str._M_dataplus._M_p != &local_d8.str.field_2) {
            operator_delete(local_d8.str._M_dataplus._M_p,
                            local_d8.str.field_2._M_allocated_capacity + 1);
          }
          p_Var5 = (_List_node_base *)(lVar7 + -1);
        }
        else if ((cVar1 == '/') || (cVar1 == '\\')) {
          core::string<char>::subString(&local_d8,&local_b8,begin,(int)p_Var5 - begin,false);
          ::std::__cxx11::string::_M_assign((string *)&local_68);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8.str._M_dataplus._M_p != &local_d8.str.field_2) {
            operator_delete(local_d8.str._M_dataplus._M_p,
                            local_d8.str.field_2._M_allocated_capacity + 1);
          }
          core::string<char>::subString(&local_d8,&local_b8,0,begin,false);
          if (&local_d8 != __return_storage_ptr__) {
            ::std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
          }
          pCVar11 = local_98;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8.str._M_dataplus._M_p != &local_d8.str.field_2) {
            operator_delete(local_d8.str._M_dataplus._M_p,
                            local_d8.str.field_2._M_allocated_capacity + 1);
          }
          sVar2 = (__return_storage_ptr__->str)._M_string_length;
          if (sVar2 != 0) {
            pcVar3 = (__return_storage_ptr__->str)._M_dataplus._M_p;
            sVar6 = 0;
            do {
              if (pcVar3[sVar6] == '\\') {
                pcVar3[sVar6] = '/';
              }
              sVar6 = sVar6 + 1;
            } while (sVar2 != sVar6);
          }
          goto LAB_00204b8c;
        }
        length = (uint)p_Var5;
        uVar10 = uVar10 + 1;
        lVar8 = lVar7 + -1;
        bVar4 = 0 < lVar7;
        lVar7 = lVar8;
      } while (lVar8 != 0 && bVar4);
    }
    core::string<char>::subString(&local_d8,&local_b8,0,length,false);
    ::std::__cxx11::string::_M_assign((string *)&local_68);
    pCVar11 = local_98;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8.str._M_dataplus._M_p != &local_d8.str.field_2) {
      operator_delete(local_d8.str._M_dataplus._M_p,local_d8.str.field_2._M_allocated_capacity + 1);
      pCVar11 = local_98;
    }
LAB_00204b8c:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8.str._M_dataplus._M_p != &local_b8.str.field_2) {
      operator_delete(local_b8.str._M_dataplus._M_p,local_b8.str.field_2._M_allocated_capacity + 1);
    }
    (*(pCVar11->super_IFileSystem)._vptr_IFileSystem[0x13])(&local_d8,pCVar11,local_90);
    local_b8.str.field_2._M_allocated_capacity = 0;
    local_48._M_impl._M_node._M_size = 0;
    local_b8.str._M_dataplus._M_p = (pointer)&local_b8;
    local_b8.str._M_string_length = (size_type)&local_b8;
    local_48._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_48;
    local_48._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_48;
    core::string<char>::
    split<std::__cxx11::list<irr::core::string<char>,std::allocator<irr::core::string<char>>>>
              (__return_storage_ptr__,
               (list<irr::core::string<char>,_std::allocator<irr::core::string<char>_>_> *)&local_b8
               ,"/\\",2,true,false);
    core::string<char>::
    split<std::__cxx11::list<irr::core::string<char>,std::allocator<irr::core::string<char>>>>
              (&local_d8,
               (list<irr::core::string<char>,_std::allocator<irr::core::string<char>_>_> *)&local_48
               ,"/\\",2,true,false);
    p_Var5 = (_List_node_base *)&local_b8;
    p_Var9 = (_List_node_base *)&local_48;
    do {
      p_Var5 = (((_List_base<irr::core::string<char>,_std::allocator<irr::core::string<char>_>_> *)
                &p_Var5->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      p_Var9 = (((_List_base<irr::core::string<char>,_std::allocator<irr::core::string<char>_>_> *)
                &p_Var9->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      if ((p_Var5 == (_List_node_base *)&local_b8) || (p_Var9 == (_List_node_base *)&local_48))
      break;
      bVar4 = core::string<char>::operator==
                        ((string<char> *)(p_Var5 + 1),(string<char> *)(p_Var9 + 1));
    } while (bVar4);
    core::string<char>::operator=(__return_storage_ptr__,"");
    for (; p_Var9 != (_List_node_base *)&local_48; p_Var9 = p_Var9->_M_next) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__,0x236038);
    }
    while (p_Var5 != (_List_node_base *)&local_b8) {
      p_Var9 = p_Var5->_M_next;
      ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)p_Var5[1]._M_next);
      ::std::__cxx11::string::_M_replace_aux
                ((ulong)__return_storage_ptr__,(__return_storage_ptr__->str)._M_string_length,0,
                 '\x01');
      p_Var5 = p_Var9;
    }
    ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_68);
    if ((int)local_80 != 0) {
      ::std::__cxx11::string::_M_replace_aux
                ((ulong)__return_storage_ptr__,(__return_storage_ptr__->str)._M_string_length,0,
                 '\x01');
      ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_88);
    }
    std::__cxx11::_List_base<irr::core::string<char>,_std::allocator<irr::core::string<char>_>_>::
    _M_clear(&local_48);
    std::__cxx11::_List_base<irr::core::string<char>,_std::allocator<irr::core::string<char>_>_>::
    _M_clear((_List_base<irr::core::string<char>,_std::allocator<irr::core::string<char>_>_> *)
             &local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8.str._M_dataplus._M_p != &local_d8.str.field_2) {
      operator_delete(local_d8.str._M_dataplus._M_p,local_d8.str.field_2._M_allocated_capacity + 1);
    }
    if (local_88 != &local_78) {
      operator_delete(local_88,CONCAT71(uStack_77,local_78) + 1);
    }
    if (local_68 != &local_58) {
      operator_delete(local_68,CONCAT71(uStack_57,local_58) + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

path CFileSystem::getRelativeFilename(const path &filename, const path &directory) const
{
	if (filename.empty() || directory.empty())
		return filename;

	io::path path1, file, ext;
	core::splitFilename(getAbsolutePath(filename), &path1, &file, &ext);
	io::path path2(getAbsolutePath(directory));
	std::list<io::path> list1, list2;
	path1.split(list1, _IRR_TEXT("/\\"), 2);
	path2.split(list2, _IRR_TEXT("/\\"), 2);
	std::list<io::path>::const_iterator it1, it2;
	it1 = list1.begin();
	it2 = list2.begin();

#if defined(_IRR_WINDOWS_API_)
	fschar_t partition1 = 0, partition2 = 0;
	io::path prefix1, prefix2;
	if (it1 != list1.end())
		prefix1 = *it1;
	if (it2 != list2.end())
		prefix2 = *it2;
	if (prefix1.size() > 1 && prefix1[1] == _IRR_TEXT(':'))
		partition1 = core::locale_lower(prefix1[0]);
	if (prefix2.size() > 1 && prefix2[1] == _IRR_TEXT(':'))
		partition2 = core::locale_lower(prefix2[0]);

	// must have the same prefix or we can't resolve it to a relative filename
	if (partition1 != partition2) {
		return filename;
	}
#endif

	for (; it1 != list1.end() && it2 != list2.end()
#if defined(_IRR_WINDOWS_API_)
			&& (io::path(*it1).make_lower() == io::path(*it2).make_lower())
#else
			&& (*it1 == *it2)
#endif
					;) {
		++it1;
		++it2;
	}
	path1 = _IRR_TEXT("");
	for (; it2 != list2.end(); ++it2)
		path1 += _IRR_TEXT("../");
	while (it1 != list1.end()) {
		path1 += *it1++;
		path1 += _IRR_TEXT('/');
	}
	path1 += file;
	if (ext.size()) {
		path1 += _IRR_TEXT('.');
		path1 += ext;
	}
	return path1;
}